

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboCases::SharedColorbufferTest::render
          (SharedColorbufferTest *this,Context *context,Surface *dst)

{
  GLenum GVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined8 uVar4;
  deUint32 program;
  deUint32 dVar5;
  uint uVar6;
  deUint32 dVar7;
  uint uVar8;
  DataTypes *samplerTypes;
  FboConfig *pFVar9;
  Vector<float,_4> local_4c0;
  Vector<float,_4> local_4b0;
  TextureFormat local_4a0;
  Vector<float,_3> local_498;
  Vector<float,_3> local_48c;
  Vector<float,_3> local_480;
  Vector<float,_3> local_474;
  Vector<float,_4> local_468;
  Vector<float,_3> local_458;
  Vector<float,_3> local_44c;
  Vector<float,_3> local_440;
  Vector<float,_3> local_434;
  Vector<float,_3> local_428;
  Vector<float,_3> local_41c;
  undefined1 local_410 [8];
  Framebuffer fboB;
  FboConfig cfg;
  Framebuffer fboA;
  bool stencil;
  deUint32 metaballsTex;
  deUint32 quadsTex;
  int height;
  int width;
  deUint32 flatShaderID;
  deUint32 texShaderID;
  FlatColorShader flatShader;
  Vector<float,_4> local_1f4;
  DataTypes local_1d8;
  undefined1 local_1b8 [8];
  Texture2DShader texShader;
  Surface *dst_local;
  Context *context_local;
  SharedColorbufferTest *this_local;
  
  local_1d8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texShader._400_8_ = dst;
  FboTestUtil::DataTypes::DataTypes(&local_1d8);
  samplerTypes = FboTestUtil::DataTypes::operator<<(&local_1d8,TYPE_SAMPLER_2D);
  tcu::Vector<float,_4>::Vector(&local_1f4,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&flatShader.super_ShaderProgram.field_0x154,0.0)
  ;
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_1b8,samplerTypes,TYPE_FLOAT_VEC4,&local_1f4,
             (Vec4 *)&flatShader.super_ShaderProgram.field_0x154);
  FboTestUtil::DataTypes::~DataTypes(&local_1d8);
  FboTestUtil::FlatColorShader::FlatColorShader((FlatColorShader *)&flatShaderID,TYPE_FLOAT_VEC4);
  program = (*context->_vptr_Context[0x75])(context,local_1b8);
  dVar5 = (*context->_vptr_Context[0x75])(context,&flatShaderID);
  uVar6 = (this->super_FboRenderCase).m_config.buffers >> 10;
  (*context->_vptr_Context[0x34])(context,0xbd0);
  createQuadsTex2D(context,1,0x1907,0x1401,0x40,0x40);
  createMetaballsTex2D(context,2,0x1908,0x1401,0x40,0x40);
  (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
  Framebuffer::Framebuffer
            ((Framebuffer *)&cfg.height,context,&(this->super_FboRenderCase).m_config,0x80,0x80,0,0,
             0);
  Framebuffer::checkCompleteness((Framebuffer *)&cfg.height);
  uVar2 = (this->super_FboRenderCase).m_config.buffers;
  uVar3._0_4_ = (this->super_FboRenderCase).m_config.colorFormat;
  uVar3._4_4_ = (this->super_FboRenderCase).m_config.depthStencilType;
  cfg.colorFormat = (this->super_FboRenderCase).m_config.depthStencilFormat;
  cfg.depthStencilType = (this->super_FboRenderCase).m_config.width;
  cfg.depthStencilFormat = (this->super_FboRenderCase).m_config.height;
  cfg.width = (this->super_FboRenderCase).m_config.samples;
  fboB.m_depthStencilBuffer = uVar2 & 0xffffbfff;
  fboB._52_4_ = 0;
  cfg._0_8_ = uVar3 & 0xffffffff00000000;
  Framebuffer::Framebuffer
            ((Framebuffer *)local_410,context,(FboConfig *)&fboB.m_depthStencilBuffer,0x80,0x80,0,0,
             0);
  dVar7 = Framebuffer::getFramebuffer((Framebuffer *)local_410);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar7);
  GVar1 = (this->super_FboRenderCase).m_config.colorType;
  if (GVar1 == 0xde1) {
    dVar7 = Framebuffer::getColorBuffer((Framebuffer *)&cfg.height);
    (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,(ulong)dVar7,0);
  }
  else if (GVar1 == 0x8d41) {
    dVar7 = Framebuffer::getColorBuffer((Framebuffer *)&cfg.height);
    (*context->_vptr_Context[0x20])(context,0x8d40,0x8ce0,0x8d41,(ulong)dVar7);
  }
  (*context->_vptr_Context[0x2d])(context,0x500);
  dVar7 = Framebuffer::getFramebuffer((Framebuffer *)&cfg.height);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar7);
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  if ((uVar6 & 1) != 0) {
    (*context->_vptr_Context[0x2c])(context,1);
    (*context->_vptr_Context[0x2d])(context,0x400);
  }
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_1b8,context,program);
  (*context->_vptr_Context[0x33])(context,0xb71);
  tcu::Vector<float,_3>::Vector(&local_41c,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_428,1.0,1.0,0.0);
  sglr::drawQuad(context,program,&local_41c,&local_428);
  (*context->_vptr_Context[0x34])(context,0xb71);
  dVar7 = Framebuffer::getFramebuffer((Framebuffer *)local_410);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar7);
  (*context->_vptr_Context[6])(context,0xde1,2);
  (*context->_vptr_Context[0x33])(context,0xbe2);
  (*context->_vptr_Context[0x42])(context,0x302,0x303,0,1);
  tcu::Vector<float,_3>::Vector(&local_434,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_440,1.0,1.0,0.0);
  sglr::drawQuad(context,program,&local_434,&local_440);
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x33])(context,0xb71);
  tcu::Vector<float,_3>::Vector(&local_44c,0.5,0.5,0.5);
  tcu::Vector<float,_3>::Vector(&local_458,1.0,1.0,0.5);
  sglr::drawQuad(context,program,&local_44c,&local_458);
  (*context->_vptr_Context[0x34])(context,0xb71);
  if ((uVar6 & 1) != 0) {
    tcu::Vector<float,_4>::Vector(&local_468,0.0,1.0,0.0,1.0);
    FboTestUtil::FlatColorShader::setColor
              ((FlatColorShader *)&flatShaderID,context,dVar5,&local_468);
    (*context->_vptr_Context[0x33])(context,0xc11);
    (*context->_vptr_Context[0x32])(context,10,10,0xc,0x19);
    (*context->_vptr_Context[0x2c])(context,1);
    (*context->_vptr_Context[0x2d])(context,0x400);
    (*context->_vptr_Context[0x34])(context,0xc11);
    (*context->_vptr_Context[0x33])(context,0xb90);
    (*context->_vptr_Context[0x35])(context,0x202,1,0xff);
    tcu::Vector<float,_3>::Vector(&local_474,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_480,1.0,1.0,0.0);
    sglr::drawQuad(context,dVar5,&local_474,&local_480);
    (*context->_vptr_Context[0x34])(context,0xb90);
  }
  pFVar9 = Framebuffer::getConfig((Framebuffer *)&cfg.height);
  uVar4 = texShader._400_8_;
  if (pFVar9->colorType == 0xde1) {
    FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_1b8,context,program);
    (*context->_vptr_Context[9])(context,0x8d40,0);
    dVar5 = Framebuffer::getColorBuffer((Framebuffer *)&cfg.height);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)dVar5);
    uVar6 = (*context->_vptr_Context[2])();
    uVar8 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar6,(ulong)uVar8);
    tcu::Vector<float,_3>::Vector(&local_48c,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_498,1.0,1.0,0.0);
    sglr::drawQuad(context,program,&local_48c,&local_498);
    uVar4 = texShader._400_8_;
    uVar6 = (*context->_vptr_Context[2])();
    uVar8 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[0x80])(context,uVar4,0,0,(ulong)uVar6,(ulong)uVar8);
  }
  else {
    pFVar9 = Framebuffer::getConfig((Framebuffer *)&cfg.height);
    local_4a0 = glu::mapGLInternalFormat(pFVar9->colorFormat);
    tcu::Vector<float,_4>::Vector(&local_4b0,1.0);
    tcu::Vector<float,_4>::Vector(&local_4c0,0.0);
    FboTestUtil::readPixels(context,(Surface *)uVar4,0,0,0x80,0x80,&local_4a0,&local_4b0,&local_4c0)
    ;
  }
  Framebuffer::~Framebuffer((Framebuffer *)local_410);
  Framebuffer::~Framebuffer((Framebuffer *)&cfg.height);
  FboTestUtil::FlatColorShader::~FlatColorShader((FlatColorShader *)&flatShaderID);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_1b8);
  return;
}

Assistant:

void SharedColorbufferTest::render (sglr::Context& context, Surface& dst)
{
	Texture2DShader			texShader		(DataTypes() << glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC4);
	FlatColorShader			flatShader		(glu::TYPE_FLOAT_VEC4);
	deUint32				texShaderID		= context.createProgram(&texShader);
	deUint32				flatShaderID	= context.createProgram(&flatShader);

	int						width			= 128;
	int						height			= 128;
	deUint32				quadsTex		= 1;
	deUint32				metaballsTex	= 2;
	bool					stencil			= (m_config.buffers & GL_STENCIL_BUFFER_BIT) != 0;

	context.disable(GL_DITHER);

	// Textures
	createQuadsTex2D(context, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createMetaballsTex2D(context, metaballsTex, GL_RGBA, GL_UNSIGNED_BYTE, 64, 64);

	context.viewport(0, 0, width, height);

	// Fbo A
	Framebuffer fboA(context, m_config, width, height);
	fboA.checkCompleteness();

	// Fbo B - don't create colorbuffer
	FboConfig cfg = m_config;
	cfg.buffers		&= ~GL_COLOR_BUFFER_BIT;
	cfg.colorType	 = GL_NONE;
	cfg.colorFormat	 = GL_NONE;
	Framebuffer fboB(context, cfg, width, height);

	// Attach color buffer from fbo A
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	switch (m_config.colorType)
	{
		case GL_TEXTURE_2D:
			context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, fboA.getColorBuffer(), 0);
			break;

		case GL_RENDERBUFFER:
			context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, fboA.getColorBuffer());
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Clear depth and stencil in fbo B
	context.clear(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	// Render quads to fbo 1, with depth 0.0
	context.bindFramebuffer(GL_FRAMEBUFFER, fboA.getFramebuffer());
	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	context.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	if (stencil)
	{
		// Stencil to 1 in fbo A
		context.clearStencil(1);
		context.clear(GL_STENCIL_BUFFER_BIT);
	}

	texShader.setUniforms(context, texShaderID);

	context.enable(GL_DEPTH_TEST);
	sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	context.disable(GL_DEPTH_TEST);

	// Blend metaballs to fbo 2
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	context.enable(GL_BLEND);
	context.blendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ZERO, GL_ONE);
	sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	// Render small quad that is only visible if depth buffer is not shared with fbo A - or there is no depth bits
	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	context.enable(GL_DEPTH_TEST);
	sglr::drawQuad(context, texShaderID, Vec3(0.5f, 0.5f, 0.5f), Vec3(1.0f, 1.0f, 0.5f));
	context.disable(GL_DEPTH_TEST);

	if (stencil)
	{
		flatShader.setColor(context, flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		// Clear subset of stencil buffer to 1
		context.enable(GL_SCISSOR_TEST);
		context.scissor(10, 10, 12, 25);
		context.clearStencil(1);
		context.clear(GL_STENCIL_BUFFER_BIT);
		context.disable(GL_SCISSOR_TEST);

		// Render quad with stencil mask == 1
		context.enable(GL_STENCIL_TEST);
		context.stencilFunc(GL_EQUAL, 1, 0xffu);
		sglr::drawQuad(context, flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		context.disable(GL_STENCIL_TEST);
	}

	// Get results
	if (fboA.getConfig().colorType == GL_TEXTURE_2D)
	{
		texShader.setUniforms(context, texShaderID);

		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.bindTexture(GL_TEXTURE_2D, fboA.getColorBuffer());
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
		readPixels(context, dst, 0, 0, width, height, glu::mapGLInternalFormat(fboA.getConfig().colorFormat), Vec4(1.0f), Vec4(0.0f));
}